

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall
cmCTestMultiProcessHandler::LockResources(cmCTestMultiProcessHandler *this,int index)

{
  mapped_type pcVar1;
  const_iterator __position;
  size_t sVar2;
  mapped_type *ppcVar3;
  bool bVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> affinity;
  int local_4c;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_4c = index;
  sVar2 = GetProcessorsUsed(this,index);
  this->RunningCount = this->RunningCount + sVar2;
  ppcVar3 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_4c);
  pcVar1 = *ppcVar3;
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->ProjectResourcesLocked,
             (pcVar1->ProjectResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&(pcVar1->ProjectResources)._M_t._M_impl.super__Rb_tree_header);
  if (pcVar1->RunSerial == true) {
    this->SerialTestRunning = true;
  }
  if ((this->HaveAffinity != 0) && (pcVar1->WantAffinity == true)) {
    sVar2 = GetProcessorsUsed(this,local_4c);
    if ((this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar2) {
      __assert_fail("needProcessors <= this->ProcessorsAvailable.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                    ,0x1cd,"void cmCTestMultiProcessHandler::LockResources(int)");
    }
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,sVar2);
    while (bVar4 = sVar2 != 0, sVar2 = sVar2 - 1, bVar4) {
      __position._M_node =
           (this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
                 (value_type_conflict1 *)(__position._M_node + 1));
      std::
      _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
      ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                          *)&this->ProcessorsAvailable,__position);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              (&pcVar1->Affinity,&local_48);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::LockResources(int index)
{
  this->RunningCount += this->GetProcessorsUsed(index);

  auto* properties = this->Properties[index];

  this->ProjectResourcesLocked.insert(properties->ProjectResources.begin(),
                                      properties->ProjectResources.end());

  if (properties->RunSerial) {
    this->SerialTestRunning = true;
  }

  if (this->HaveAffinity && properties->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(index);
    assert(needProcessors <= this->ProcessorsAvailable.size());
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    properties->Affinity = std::move(affinity);
  }
}